

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

iterator __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
::find<std::__cxx11::string>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key,size_t hash)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  anon_union_8_1_a8a14541_for_iterator_1 unaff_RBP;
  anon_union_8_1_a8a14541_for_iterator_1 aVar8;
  ctrl_t *unaff_R13;
  ulong uVar9;
  ctrl_t *pcVar10;
  bool bVar11;
  iterator iVar12;
  __m128i match;
  ulong local_b0;
  long local_a0;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_int_&>_>
  local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar2 = *(ulong *)(this + 0x18);
  local_b0 = hash >> 7 & uVar2;
  local_58 = vpbroadcastb_avx512vl();
  local_a0 = 0;
  do {
    local_48 = *(undefined1 (*) [16])(*(long *)this + local_b0);
    uVar9 = vpcmpeqb_avx512vl(local_48,local_58);
    bVar11 = (short)uVar9 == 0;
    while (aVar8 = unaff_RBP, pcVar10 = unaff_R13, !bVar11) {
      uVar4 = 0;
      uVar7 = (uint)uVar9;
      for (uVar5 = uVar7; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x80000000) {
        uVar4 = uVar4 + 1;
      }
      uVar9 = uVar4 + local_b0 & uVar2;
      lVar1 = uVar9 * 0x28;
      local_68.second.super__Tuple_impl<0UL,_const_int_&>.super__Head_base<0UL,_const_int_&,_false>.
      _M_head_impl = (_Tuple_impl<0UL,_const_int_&>)(*(long *)(this + 8) + 0x20 + lVar1);
      local_68.first.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 8) + lVar1);
      local_78.rhs = key;
      local_78.eq = (key_equal *)(this + 0x28);
      bVar6 = memory_internal::
              DecomposePairImpl<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<int_const&>>
                        (&local_78,&local_68);
      pcVar10 = (ctrl_t *)(uVar9 + *(long *)this);
      aVar8.slot_ = (slot_type *)(lVar1 + *(long *)(this + 8));
      if (bVar6) break;
      uVar7 = uVar7 - 1 & uVar7;
      uVar9 = (ulong)uVar7;
      bVar11 = uVar7 == 0;
    }
    if (bVar11) {
      auVar3 = vpsignb_avx(local_48,local_48);
      if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar3 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar3 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar3 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar3 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar3[0xf] < '\0')
      {
        pcVar10 = (ctrl_t *)(*(long *)this + *(long *)(this + 0x18));
        goto LAB_0016f93e;
      }
      lVar1 = local_a0 + 0x10;
      local_a0 = local_a0 + 0x10;
      local_b0 = lVar1 + local_b0 & uVar2;
      bVar11 = true;
    }
    else {
LAB_0016f93e:
      bVar11 = false;
    }
    unaff_RBP = aVar8;
    unaff_R13 = pcVar10;
    if (!bVar11) {
      iVar12.field_1 =
           (anon_union_8_1_a8a14541_for_iterator_1)
           (anon_union_8_1_a8a14541_for_iterator_1)aVar8.slot_;
      iVar12.ctrl_ = pcVar10;
      return iVar12;
    }
  } while( true );
}

Assistant:

iterator find(const key_arg<K>& key, size_t hash) {
        auto seq = probe(hash);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (int i : g.Match(H2(hash))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset(i)))))
                    return iterator_at(seq.offset(i));
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) 
                return end();
            seq.next();
        }
    }